

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void ExpressionStatement_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  JsVm *pJVar1;
  JsValue *v;
  JsValue r1;
  JsAstUnaryNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  r1.u.reference.name = (char *)na;
  res_00 = (JsValue *)JsMalloc(0x18);
  context->pc = na->location;
  pJVar1 = JsGetVm();
  if (pJVar1->debug == 1) {
    pJVar1 = JsGetVm();
    if (pJVar1->trace != (JsVmTraceFn)0x0) {
      pJVar1 = JsGetVm();
      (*pJVar1->trace)(context->engine,na->location,JS_TRACE_STATEMENT);
    }
  }
  (*JsNodeClassEval[**(uint **)(r1.u.reference.name + 0x10)])
            (*(JsAstNode **)(r1.u.reference.name + 0x10),context,(JsValue *)&v);
  JsGetValue((JsValue *)&v,res_00);
  res->type = JS_COMPLETION;
  (res->u).completion.type = JS_COMPLETION_NORMAL;
  (res->u).completion.value = res_00;
  return;
}

Assistant:

static void
ExpressionStatement_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1;
	struct JsValue *v = (struct JsValue*)JsMalloc(sizeof(struct JsValue));

	TRACE(na->location, context, JS_TRACE_STATEMENT);
	EVAL(n->a, context, &r1);
	JsGetValue(&r1, v);
	JS_SET_COMPLETION(res, JS_COMPLETION_NORMAL, v);
}